

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O0

string * gmlc::netif::addressToString_abi_cxx11_(sockaddr *addr,int sa_len)

{
  uint __af;
  ushort *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  void *src_addr;
  char addr_str [46];
  int family;
  allocator<char> local_51;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  __af = (uint)*in_RSI;
  if (__af == 2) {
    __a = (allocator<char> *)(in_RSI + 2);
  }
  else {
    if (__af != 10) {
      std::__cxx11::string::string(in_RDI);
      return (string *)in_RDI;
    }
    __a = (allocator<char> *)(in_RSI + 4);
  }
  inet_ntop(__af,__a,&stack0xffffffffffffffb8,0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__a);
  std::allocator<char>::~allocator(&local_51);
  return (string *)in_RDI;
}

Assistant:

inline std::string addressToString(struct sockaddr* addr, int sa_len)
    {
#if defined(__MINGW32__)
        char addr_str[NI_MAXHOST];
        if (getnameinfo(addr, sa_len, addr_str, NI_MAXHOST, 0, 0, NI_NUMERICHOST) != 0) {
            return std::string();
        }
#else
        (void)sa_len;
        int family = addr->sa_family;
        char addr_str[INET6_ADDRSTRLEN];
        void* src_addr = nullptr;
        switch (family) {
            case AF_INET:
                src_addr = &(reinterpret_cast<struct sockaddr_in*>(addr)->sin_addr);
                break;
            case AF_INET6:
                src_addr = &(reinterpret_cast<struct sockaddr_in6*>(addr)->sin6_addr);
                break;
            default:  // Invalid address type for conversion to text
                return std::string();
        }
        inet_ntop(family, src_addr, addr_str, INET6_ADDRSTRLEN);
#endif

        return std::string(addr_str);
    }